

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O2

int exploration::
    swap_chosen<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
              (undefined4 *action_first,undefined4 *action_last,uint param_3)

{
  undefined4 uVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 1;
  if (((action_first <= action_last && (long)action_last - (long)action_first != 0) &&
      (uVar3 = (ulong)param_3, uVar3 < (ulong)((long)action_last - (long)action_first >> 2))) &&
     (iVar2 = 0, param_3 != 0)) {
    uVar1 = *action_first;
    *action_first = action_first[uVar3];
    action_first[uVar3] = uVar1;
  }
  return iVar2;
}

Assistant:

int swap_chosen(ActionIt action_first, ActionIt action_last, std::forward_iterator_tag /* action_category */, uint32_t chosen_index)
  {
    if ( action_last < action_first )
      return E_EXPLORATION_BAD_RANGE;

    size_t action_size = action_last - action_first;

    if ( action_size == 0 )
      return E_EXPLORATION_BAD_RANGE;

    if ( chosen_index >= action_size )
      return E_EXPLORATION_BAD_RANGE;

    // swap top element with chosen one
    if ( chosen_index != 0 ) {
      std::iter_swap(action_first, action_first + chosen_index);
    }

    return S_EXPLORATION_OK;
  }